

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int64_t __thiscall
aeron::archive::AeronArchive::pollForDescriptors
          (AeronArchive *this,int64_t correlationId,int32_t recordCount,
          RecordingDescriptorConsumer *consumer)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  long lVar4;
  shared_ptr<aeron::Subscription> *psVar5;
  long lVar6;
  ArchiveException *pAVar7;
  char *pcVar8;
  nfds_t extraout_RDX;
  nfds_t __nfds;
  nfds_t extraout_RDX_00;
  nfds_t extraout_RDX_01;
  allocator local_be;
  allocator local_bd;
  int32_t local_bc;
  int64_t local_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  lVar4 = lVar4 + (this->messageTimeoutNs_).__r;
  local_b8 = correlationId;
  RecordingDescriptorPoller::reset
            ((this->recordingDescriptorPoller_)._M_t.
             super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
             ._M_t.
             super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
             .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl
             ,correlationId,recordCount,consumer);
  __nfds = extraout_RDX;
  local_bc = recordCount;
  while( true ) {
    do {
      iVar2 = RecordingDescriptorPoller::poll
                        ((this->recordingDescriptorPoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                         _M_head_impl,(pollfd *)correlationId,__nfds,(int)consumer);
      iVar3 = RecordingDescriptorPoller::remainingRecordCount
                        ((this->recordingDescriptorPoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                         _M_head_impl);
      bVar1 = RecordingDescriptorPoller::isDispatchComplete
                        ((this->recordingDescriptorPoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                         _M_head_impl);
      if (bVar1) {
        return (long)(local_bc - iVar3);
      }
      if (recordCount != iVar3) {
        lVar4 = std::chrono::_V2::system_clock::now();
        lVar4 = lVar4 + (this->messageTimeoutNs_).__r;
        recordCount = iVar3;
      }
      concurrent::AgentInvoker<aeron::ClientConductor>::invoke
                (&((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_conductorInvoker);
      __nfds = extraout_RDX_00;
    } while (0 < iVar2);
    psVar5 = RecordingDescriptorPoller::subscription
                       ((this->recordingDescriptorPoller_)._M_t.
                        super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                        .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                        _M_head_impl);
    bVar1 = Subscription::isConnected
                      ((psVar5->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr);
    if (!bVar1) break;
    lVar6 = std::chrono::_V2::system_clock::now();
    if (lVar4 < lVar6) {
      pAVar7 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_90,local_b8);
      std::operator+(&local_70,"awaiting recording descriptors: correlationId=",&local_90);
      std::__cxx11::string::string
                ((string *)&local_b0,
                 "std::int64_t aeron::archive::AeronArchive::pollForDescriptors(std::int64_t, std::int32_t, RecordingDescriptorConsumer &&)"
                 ,&local_bd);
      pcVar8 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::__cxx11::string::string((string *)&local_50,pcVar8,&local_be);
      ArchiveException::ArchiveException(pAVar7,&local_70,&local_b0,&local_50,0x1b4);
      __cxa_throw(pAVar7,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    sched_yield();
    __nfds = extraout_RDX_01;
  }
  pAVar7 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string
            ((string *)&local_70,"subscription to archive is not connected",(allocator *)&local_50);
  std::__cxx11::string::string
            ((string *)&local_90,
             "std::int64_t aeron::archive::AeronArchive::pollForDescriptors(std::int64_t, std::int32_t, RecordingDescriptorConsumer &&)"
             ,&local_bd);
  pcVar8 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)&local_b0,pcVar8,&local_be);
  ArchiveException::ArchiveException(pAVar7,&local_70,&local_90,&local_b0,0x1af);
  __cxa_throw(pAVar7,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::int64_t AeronArchive::pollForDescriptors(std::int64_t correlationId, std::int32_t recordCount,
                                              RecordingDescriptorConsumer&& consumer) {
    std::int32_t existingRemainCount = recordCount;
    auto deadline = Clock::now() + messageTimeoutNs_;

    recordingDescriptorPoller_->reset(correlationId, recordCount, std::move(consumer));

    while (true) {
        std::int32_t fragments = recordingDescriptorPoller_->poll();
        std::int32_t remainingRecordCount = recordingDescriptorPoller_->remainingRecordCount();

        if (recordingDescriptorPoller_->isDispatchComplete()) {
            return recordCount - remainingRecordCount;
        }

        if (existingRemainCount != remainingRecordCount) {
            existingRemainCount = remainingRecordCount;
            deadline = Clock::now() + messageTimeoutNs_;
        }

        aeron_->conductorAgentInvoker().invoke();

        if (fragments > 0) {
            continue;
        }

        if (!recordingDescriptorPoller_->subscription()->isConnected()) {
            throw ArchiveException("subscription to archive is not connected", SOURCEINFO);
        }

        if (Clock::now() > deadline) {
            throw ArchiveException("awaiting recording descriptors: correlationId=" + std::to_string(correlationId),
                                   SOURCEINFO);
        }

        idleStrategy_.idle();
    }
}